

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int declaration(void)

{
  int iVar1;
  sym_t *s;
  sym_t *s_00;
  char *message;
  
  s = create_sym();
  iVar1 = declaration_specifiers(s);
  if (iVar1 != 0) {
    if (t->id == 0x3b) {
      if (last_id - 0x80U < 6) {
        message = &DAT_00108b28 + *(int *)(&DAT_00108b28 + (ulong)(last_id - 0x80U) * 4);
      }
      else {
        message = "empty declaration";
      }
      err(W,message);
    }
    iVar1 = init_declarator(s);
    while ((iVar1 != 0 && (t->id == 0x2c))) {
      s_00 = create_sym();
      strcpy(s_00->id,s->id);
      s_00->type_id = s->type_id;
      s->id[0] = '\0';
      syms_add(s_00);
      last_id = t->id;
      t = get_token();
      eline = t->line;
      ecolumn = t->column;
      iVar1 = init_declarator(s);
    }
    if (((s->type_id == 0x84) && (s->function == 0)) && (s->id[0] != '\0')) {
      err(E,"variable or field \'%s\' declared void",s);
    }
    if (t->id == 0x3b) {
      syms_add(s);
      last_id = t->id;
      t = get_token();
      eline = t->line;
      ecolumn = t->column;
      return 1;
    }
    expect(0x3b);
    sync();
  }
  free(s);
  return 0;
}

Assistant:

int declaration()
{
    sym_t* s = create_sym();

    if (declaration_specifiers(s))
    {
        if (t->id == ';')
        {
            switch(last_id)
            {
                case BYTE:
                case WORD:
                case VOID:
                    err(W, "useless type name in empty declaration");
                    break;

                default:
                    err(W, "empty declaration");
            }
        }

        init_declarator_list(s);

        if (s->type_id == VOID && !s->function && s->id[0])
            err(E, "variable or field '%s' declared void", s->id);

        if (t->id == ';') /* Do not use expect to not fuck up eline */
        {
            syms_add(s);
            next();
            return 1;
        }
        else
            expect(';'); /* Use expect to generate the error message */

        sync(";");
    }

    free(s);
    return 0;
}